

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall
phosg::Image::custom_blit
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
          *per_pixel_fn)

{
  long y_00;
  long x_00;
  long x_01;
  long lVar1;
  ssize_t x_02;
  bool bVar2;
  uint64_t da;
  uint64_t db;
  uint64_t dg;
  uint64_t dr;
  uint64_t sa;
  uint64_t sb;
  uint64_t sg;
  uint64_t sr;
  uint64_t local_e0;
  ssize_t local_d8;
  ssize_t local_d0;
  ssize_t local_c8;
  ssize_t local_c0;
  ssize_t local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  ssize_t local_88;
  long local_80;
  uint64_t local_78;
  uint64_t local_70;
  uint64_t local_68;
  unsigned_long local_60;
  unsigned_long local_58;
  unsigned_long local_50;
  unsigned_long local_48;
  ssize_t local_40;
  ssize_t local_38;
  
  local_d0 = w;
  if (w < 0) {
    local_d0 = source->width;
  }
  local_d8 = h;
  if (h < 0) {
    local_d8 = source->height;
  }
  local_40 = y;
  local_38 = x;
  clamp_blit_dimensions(this,source,&local_38,&local_40,&local_d0,&local_d8,&sx,&sy);
  local_b0 = sx;
  local_b8 = sy;
  local_c0 = local_38;
  local_98 = 0;
  local_a8 = local_d0;
  if (local_d0 < 1) {
    local_a8 = local_98;
  }
  local_c8 = local_40;
  local_a0 = local_d8;
  if (local_d8 < 1) {
    local_a0 = local_98;
  }
  for (; local_98 != local_a0; local_98 = local_98 + 1) {
    local_88 = local_b8 + local_98;
    local_90 = local_c8 + local_98;
    x_01 = local_b0;
    lVar1 = local_a8;
    x_02 = local_c0;
    while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
      read_pixel(source,x_01,local_88,&local_48,&local_50,&local_58,&local_60);
      y_00 = local_90;
      local_80 = x_02;
      read_pixel(this,x_02,local_90,&local_68,&local_70,&local_78,&local_e0);
      x_00 = local_80;
      ::std::
      function<void_(unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long,_unsigned_long,_unsigned_long,_unsigned_long)>
      ::operator()(per_pixel_fn,&local_68,&local_70,&local_78,&local_e0,local_48,local_50,local_58,
                   local_60);
      write_pixel(this,x_00,y_00,local_68,local_70,local_78,local_e0);
      x_01 = x_01 + 1;
      x_02 = x_00 + 1;
    }
  }
  return;
}

Assistant:

void Image::custom_blit(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy,
    function<void(uint64_t&, uint64_t&, uint64_t&, uint64_t&, uint64_t, uint64_t, uint64_t, uint64_t)> per_pixel_fn) {
  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t sr, sg, sb, sa, dr, dg, db, da;
      source.read_pixel(sx + xx, sy + yy, &sr, &sg, &sb, &sa);
      this->read_pixel(x + xx, y + yy, &dr, &dg, &db, &da);

      per_pixel_fn(dr, dg, db, da, sr, sg, sb, sa);

      this->write_pixel(x + xx, y + yy, dr, dg, db, da);
    }
  }
}